

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  vbool<4> vVar19;
  bool bVar20;
  uint uVar21;
  undefined4 uVar22;
  int iVar23;
  AABBNodeMB4D *node1;
  ulong uVar24;
  long lVar25;
  long lVar26;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar27;
  size_t sVar28;
  uint uVar29;
  NodeRef *pNVar30;
  NodeRef root;
  long lVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_ZMM0 [64];
  float fVar41;
  float fVar42;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar60;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar59;
  undefined1 auVar58 [64];
  float fVar61;
  float fVar75;
  float fVar76;
  vint4 ai_2;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar78;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar77;
  float fVar79;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  vint4 bi_1;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  vint4 bi_3;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  vint4 bi;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar112;
  float fVar114;
  float fVar115;
  float fVar117;
  vint4 bi_2;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar118;
  undefined1 auVar110 [16];
  float fVar113;
  float fVar116;
  float fVar119;
  undefined1 auVar111 [16];
  float fVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar125;
  float fVar132;
  float fVar133;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar134;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar135;
  float fVar141;
  float fVar142;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar143;
  undefined1 auVar140 [16];
  float fVar144;
  float fVar148;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar149;
  float fVar150;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar151 [16];
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar162;
  float fVar164;
  vint4 ai;
  undefined1 auVar160 [16];
  float fVar163;
  float fVar165;
  float fVar166;
  undefined1 auVar161 [16];
  float fVar167;
  float fVar171;
  float fVar172;
  vint4 ai_1;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar173;
  undefined1 auVar170 [16];
  float fVar174;
  float fVar176;
  float fVar177;
  vint4 ai_3;
  undefined1 auVar175 [16];
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar182 [16];
  Precalculations pre;
  float local_38a8;
  float fStack_38a4;
  float fStack_38a0;
  vbool<4> terminated;
  undefined1 local_3848 [16];
  RTCFilterFunctionNArguments args;
  undefined1 local_37d8 [16];
  BVH *local_37c8;
  Intersectors *local_37c0;
  TravRayK<4,_true> tray;
  undefined1 local_36b8 [16];
  undefined1 local_36a8 [16];
  undefined1 local_3698 [16];
  undefined1 local_3688 [16];
  undefined1 local_3678 [16];
  undefined1 local_3668 [8];
  float fStack_3660;
  float fStack_365c;
  undefined8 local_3658;
  undefined8 uStack_3650;
  undefined8 uStack_3630;
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_3598;
  undefined8 local_3568;
  undefined8 uStack_3560;
  undefined1 local_3558 [16];
  undefined1 local_3548 [16];
  undefined1 local_3538 [16];
  uint local_3528;
  uint uStack_3524;
  uint uStack_3520;
  uint uStack_351c;
  uint uStack_3518;
  uint uStack_3514;
  uint uStack_3510;
  uint uStack_350c;
  Vec3vf<4> Ng;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  undefined1 auVar147 [16];
  
  local_37c8 = (BVH *)This->ptr;
  stack_node[1].ptr = (local_37c8->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar56 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar44 = vpcmpeqd_avx(auVar56,(undefined1  [16])valid_i->field_0);
    auVar39 = ZEXT816(0) << 0x40;
    auVar10 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar39,5);
    auVar52 = auVar44 & auVar10;
    if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar52 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar52 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar52[0xf] < '\0')
    {
      auVar10 = vandps_avx(auVar10,auVar44);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar126._8_4_ = 0x7fffffff;
      auVar126._0_8_ = 0x7fffffff7fffffff;
      auVar126._12_4_ = 0x7fffffff;
      auVar44 = vandps_avx(auVar126,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar136._8_4_ = 0x219392ef;
      auVar136._0_8_ = 0x219392ef219392ef;
      auVar136._12_4_ = 0x219392ef;
      auVar52 = vcmpps_avx(auVar44,auVar136,1);
      auVar151._8_4_ = 0x3f800000;
      auVar151._0_8_ = 0x3f8000003f800000;
      auVar151._12_4_ = 0x3f800000;
      auVar96 = vdivps_avx(auVar151,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar44 = vandps_avx(auVar126,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar88 = vcmpps_avx(auVar44,auVar136,1);
      auVar53 = vdivps_avx(auVar151,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar44 = vandps_avx(auVar126,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar44 = vcmpps_avx(auVar44,auVar136,1);
      auVar107 = vdivps_avx(auVar151,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar137._8_4_ = 0x5d5e0b6b;
      auVar137._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar137._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar96,auVar137,auVar52);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar53,auVar137,auVar88);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar107,auVar137,auVar44)
      ;
      auVar44 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar39,1);
      auVar53._8_4_ = 0x20;
      auVar53._0_8_ = 0x2000000020;
      auVar53._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar44,auVar53);
      auVar44 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar39,5);
      auVar52._8_4_ = 0x40;
      auVar52._0_8_ = 0x4000000040;
      auVar52._12_4_ = 0x40;
      auVar107._8_4_ = 0x60;
      auVar107._0_8_ = 0x6000000060;
      auVar107._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar107,auVar52,auVar44)
      ;
      auVar44 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar39,5);
      auVar88._8_4_ = 0x80;
      auVar88._0_8_ = 0x8000000080;
      auVar88._12_4_ = 0x80;
      auVar96._8_4_ = 0xa0;
      auVar96._0_8_ = 0xa0000000a0;
      auVar96._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar96,auVar88,auVar44);
      auVar44 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar39);
      auVar52 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar39);
      auVar39._8_4_ = 0x7f800000;
      auVar39._0_8_ = 0x7f8000007f800000;
      auVar39._12_4_ = 0x7f800000;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar39,auVar44,auVar10);
      auVar44._8_4_ = 0xff800000;
      auVar44._0_8_ = 0xff800000ff800000;
      auVar44._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar44,auVar52,auVar10);
      terminated.field_0.i[1] = auVar10._4_4_ ^ auVar56._4_4_;
      terminated.field_0.i[0] = auVar10._0_4_ ^ auVar56._0_4_;
      terminated.field_0.i[2] = auVar10._8_4_ ^ auVar56._8_4_;
      terminated.field_0.i[3] = auVar10._12_4_ ^ auVar56._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar29 = 3;
      }
      else {
        uVar29 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar30 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar27 = &stack_near[2].field_0;
      stack_near[0].field_0.i[0] = 0x7f800000;
      stack_near[0].field_0.i[1] = 0x7f800000;
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      local_37c0 = This;
LAB_00fb6c2b:
      do {
        do {
          root.ptr = pNVar30[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00fb79a5;
          pNVar30 = pNVar30 + -1;
          paVar27 = paVar27 + -1;
          aVar43 = *paVar27;
          auVar56 = vcmpps_avx((undefined1  [16])aVar43,(undefined1  [16])tray.tfar.field_0,1);
          uVar21 = vmovmskps_avx(auVar56);
        } while (uVar21 == 0);
        uVar24 = (ulong)(uVar21 & 0xff);
        uVar21 = POPCOUNT(uVar21 & 0xff);
        if (uVar29 < uVar21) {
LAB_00fb6c6b:
          vVar19.field_0 = terminated.field_0;
          iVar23 = 4;
          auVar58 = ZEXT1664((undefined1  [16])aVar43);
          do {
            uVar21 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00fb79a5;
              auVar56 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar58._0_16_,6);
              if ((((auVar56 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar56 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar56 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar56[0xf]) goto LAB_00fb6c2b;
              local_3848._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              local_3848._8_4_ = terminated.field_0.i[2] ^ 0xffffffff;
              local_3848._12_4_ = terminated.field_0.i[3] ^ 0xffffffff;
              lVar31 = (root.ptr & 0xfffffffffffffff0) + 0x130;
              lVar25 = 0;
              goto LAB_00fb6f5f;
            }
            uVar24 = root.ptr & 0xfffffffffffffff0;
            auVar56 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar58._0_16_,6);
            auVar58 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            root.ptr = 8;
            for (lVar25 = -0x20;
                (aVar43 = auVar58._0_16_, lVar25 != 0 &&
                (sVar28 = *(size_t *)(uVar24 + 0x40 + lVar25 * 2), sVar28 != 8));
                lVar25 = lVar25 + 4) {
              fVar2 = *(float *)(uVar24 + 0x120 + lVar25);
              fVar3 = *(float *)(uVar24 + 0x60 + lVar25);
              auVar44 = *(undefined1 (*) [16])(ray + 0x70);
              fVar41 = auVar44._0_4_;
              fVar59 = auVar44._4_4_;
              fVar77 = auVar44._8_4_;
              fVar79 = auVar44._12_4_;
              auVar62._0_4_ = fVar41 * fVar2 + fVar3;
              auVar62._4_4_ = fVar59 * fVar2 + fVar3;
              auVar62._8_4_ = fVar77 * fVar2 + fVar3;
              auVar62._12_4_ = fVar79 * fVar2 + fVar3;
              fVar2 = *(float *)(uVar24 + 0x160 + lVar25);
              fVar3 = *(float *)(uVar24 + 0xa0 + lVar25);
              auVar80._0_4_ = fVar41 * fVar2 + fVar3;
              auVar80._4_4_ = fVar59 * fVar2 + fVar3;
              auVar80._8_4_ = fVar77 * fVar2 + fVar3;
              auVar80._12_4_ = fVar79 * fVar2 + fVar3;
              fVar2 = *(float *)(uVar24 + 0x1a0 + lVar25);
              fVar3 = *(float *)(uVar24 + 0xe0 + lVar25);
              auVar89._0_4_ = fVar41 * fVar2 + fVar3;
              auVar89._4_4_ = fVar59 * fVar2 + fVar3;
              auVar89._8_4_ = fVar77 * fVar2 + fVar3;
              auVar89._12_4_ = fVar79 * fVar2 + fVar3;
              fVar2 = *(float *)(uVar24 + 0x140 + lVar25);
              fVar3 = *(float *)(uVar24 + 0x80 + lVar25);
              auVar97._0_4_ = fVar41 * fVar2 + fVar3;
              auVar97._4_4_ = fVar59 * fVar2 + fVar3;
              auVar97._8_4_ = fVar77 * fVar2 + fVar3;
              auVar97._12_4_ = fVar79 * fVar2 + fVar3;
              fVar2 = *(float *)(uVar24 + 0x180 + lVar25);
              fVar3 = *(float *)(uVar24 + 0xc0 + lVar25);
              auVar108._0_4_ = fVar41 * fVar2 + fVar3;
              auVar108._4_4_ = fVar59 * fVar2 + fVar3;
              auVar108._8_4_ = fVar77 * fVar2 + fVar3;
              auVar108._12_4_ = fVar79 * fVar2 + fVar3;
              fVar2 = *(float *)(uVar24 + 0x1c0 + lVar25);
              fVar3 = *(float *)(uVar24 + 0x100 + lVar25);
              auVar121._0_4_ = fVar3 + fVar41 * fVar2;
              auVar121._4_4_ = fVar3 + fVar59 * fVar2;
              auVar121._8_4_ = fVar3 + fVar77 * fVar2;
              auVar121._12_4_ = fVar3 + fVar79 * fVar2;
              auVar14._8_8_ = tray.org.field_0._8_8_;
              auVar14._0_8_ = tray.org.field_0._0_8_;
              auVar15._8_8_ = tray.org.field_0._24_8_;
              auVar15._0_8_ = tray.org.field_0._16_8_;
              auVar16._8_8_ = tray.org.field_0._40_8_;
              auVar16._0_8_ = tray.org.field_0._32_8_;
              auVar52 = vsubps_avx(auVar62,auVar14);
              auVar160._0_4_ = tray.rdir.field_0._0_4_ * auVar52._0_4_;
              auVar160._4_4_ = tray.rdir.field_0._4_4_ * auVar52._4_4_;
              auVar160._8_4_ = tray.rdir.field_0._8_4_ * auVar52._8_4_;
              auVar160._12_4_ = tray.rdir.field_0._12_4_ * auVar52._12_4_;
              auVar52 = vsubps_avx(auVar80,auVar15);
              auVar168._0_4_ = auVar52._0_4_ * (float)tray.rdir.field_0._16_4_;
              auVar168._4_4_ = auVar52._4_4_ * (float)tray.rdir.field_0._20_4_;
              auVar168._8_4_ = auVar52._8_4_ * (float)tray.rdir.field_0._24_4_;
              auVar168._12_4_ = auVar52._12_4_ * (float)tray.rdir.field_0._28_4_;
              auVar52 = vsubps_avx(auVar89,auVar16);
              auVar175._0_4_ = auVar52._0_4_ * (float)tray.rdir.field_0._32_4_;
              auVar175._4_4_ = auVar52._4_4_ * (float)tray.rdir.field_0._36_4_;
              auVar175._8_4_ = auVar52._8_4_ * (float)tray.rdir.field_0._40_4_;
              auVar175._12_4_ = auVar52._12_4_ * (float)tray.rdir.field_0._44_4_;
              auVar52 = vsubps_avx(auVar97,auVar14);
              auVar98._0_4_ = tray.rdir.field_0._0_4_ * auVar52._0_4_;
              auVar98._4_4_ = tray.rdir.field_0._4_4_ * auVar52._4_4_;
              auVar98._8_4_ = tray.rdir.field_0._8_4_ * auVar52._8_4_;
              auVar98._12_4_ = tray.rdir.field_0._12_4_ * auVar52._12_4_;
              auVar52 = vsubps_avx(auVar108,auVar15);
              auVar81._0_4_ = auVar52._0_4_ * (float)tray.rdir.field_0._16_4_;
              auVar81._4_4_ = auVar52._4_4_ * (float)tray.rdir.field_0._20_4_;
              auVar81._8_4_ = auVar52._8_4_ * (float)tray.rdir.field_0._24_4_;
              auVar81._12_4_ = auVar52._12_4_ * (float)tray.rdir.field_0._28_4_;
              auVar52 = vsubps_avx(auVar121,auVar16);
              auVar90._0_4_ = auVar52._0_4_ * (float)tray.rdir.field_0._32_4_;
              auVar90._4_4_ = auVar52._4_4_ * (float)tray.rdir.field_0._36_4_;
              auVar90._8_4_ = auVar52._8_4_ * (float)tray.rdir.field_0._40_4_;
              auVar90._12_4_ = auVar52._12_4_ * (float)tray.rdir.field_0._44_4_;
              auVar52 = vpminsd_avx(auVar160,auVar98);
              auVar39 = vpminsd_avx(auVar168,auVar81);
              auVar52 = vpmaxsd_avx(auVar52,auVar39);
              auVar39 = vpminsd_avx(auVar175,auVar90);
              auVar52 = vpmaxsd_avx(auVar52,auVar39);
              auVar63._0_4_ = auVar52._0_4_ * 0.99999964;
              auVar63._4_4_ = auVar52._4_4_ * 0.99999964;
              auVar63._8_4_ = auVar52._8_4_ * 0.99999964;
              auVar63._12_4_ = auVar52._12_4_ * 0.99999964;
              auVar52 = vpmaxsd_avx(auVar160,auVar98);
              auVar39 = vpmaxsd_avx(auVar168,auVar81);
              auVar39 = vpminsd_avx(auVar52,auVar39);
              auVar52 = vpmaxsd_avx(auVar175,auVar90);
              auVar39 = vpminsd_avx(auVar39,auVar52);
              auVar52 = vpmaxsd_avx(auVar63,(undefined1  [16])tray.tnear.field_0);
              auVar91._0_4_ = auVar39._0_4_ * 1.0000004;
              auVar91._4_4_ = auVar39._4_4_ * 1.0000004;
              auVar91._8_4_ = auVar39._8_4_ * 1.0000004;
              auVar91._12_4_ = auVar39._12_4_ * 1.0000004;
              auVar39 = vpminsd_avx(auVar91,(undefined1  [16])tray.tfar.field_0);
              if ((uVar21 & 7) == 6) {
                auVar52 = vcmpps_avx(auVar52,auVar39,2);
                uVar22 = *(undefined4 *)(uVar24 + 0x1e0 + lVar25);
                auVar92._4_4_ = uVar22;
                auVar92._0_4_ = uVar22;
                auVar92._8_4_ = uVar22;
                auVar92._12_4_ = uVar22;
                auVar39 = vcmpps_avx(auVar92,auVar44,2);
                uVar22 = *(undefined4 *)(uVar24 + 0x200 + lVar25);
                auVar99._4_4_ = uVar22;
                auVar99._0_4_ = uVar22;
                auVar99._8_4_ = uVar22;
                auVar99._12_4_ = uVar22;
                auVar44 = vcmpps_avx(auVar44,auVar99,1);
                auVar44 = vandps_avx(auVar39,auVar44);
                auVar44 = vandps_avx(auVar44,auVar52);
              }
              else {
                auVar44 = vcmpps_avx(auVar52,auVar39,2);
              }
              auVar44 = vandps_avx(auVar44,auVar56);
              auVar44 = vpslld_avx(auVar44,0x1f);
              if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar44 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar44 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar44[0xf]) {
                auVar58 = ZEXT1664((undefined1  [16])aVar43);
                sVar28 = root.ptr;
              }
              else {
                auVar82._8_4_ = 0x7f800000;
                auVar82._0_8_ = 0x7f8000007f800000;
                auVar82._12_4_ = 0x7f800000;
                auVar44 = vblendvps_avx(auVar82,auVar63,auVar44);
                auVar58 = ZEXT1664(auVar44);
                if (root.ptr != 8) {
                  pNVar30->ptr = root.ptr;
                  pNVar30 = pNVar30 + 1;
                  *paVar27 = aVar43;
                  paVar27 = paVar27 + 1;
                }
              }
              root.ptr = sVar28;
            }
            if (root.ptr == 8) goto LAB_00fb6ef1;
            auVar56 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar43,6);
            uVar22 = vmovmskps_avx(auVar56);
          } while ((byte)uVar29 < (byte)POPCOUNT(uVar22));
          pNVar30->ptr = root.ptr;
          pNVar30 = pNVar30 + 1;
          *paVar27 = aVar43;
          paVar27 = paVar27 + 1;
        }
        else {
          while (uVar24 != 0) {
            sVar28 = 0;
            if (uVar24 != 0) {
              for (; (uVar24 >> sVar28 & 1) == 0; sVar28 = sVar28 + 1) {
              }
            }
            uVar24 = uVar24 & uVar24 - 1;
            bVar20 = occluded1(local_37c0,local_37c8,root,sVar28,&pre,ray,&tray,context);
            if (bVar20) {
              terminated.field_0.i[sVar28] = -1;
            }
          }
          auVar56 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar23 = 3;
          if ((((auVar56 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar56 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar56 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar56[0xf] < '\0') {
            auVar56._8_4_ = 0xff800000;
            auVar56._0_8_ = 0xff800000ff800000;
            auVar56._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar56,
                               (undefined1  [16])terminated.field_0);
            iVar23 = 2;
          }
          if (uVar29 < uVar21) goto LAB_00fb6c6b;
        }
LAB_00fb6ef1:
      } while ((iVar23 == 4) || (iVar23 == 2));
LAB_00fb79a5:
      auVar10 = vandps_avx(auVar10,(undefined1  [16])terminated.field_0);
      auVar57._8_4_ = 0xff800000;
      auVar57._0_8_ = 0xff800000ff800000;
      auVar57._12_4_ = 0xff800000;
      auVar10 = vmaskmovps_avx(auVar10,auVar57);
      *(undefined1 (*) [16])pRVar1 = auVar10;
    }
  }
  return;
LAB_00fb6f5f:
  do {
    auVar56 = auVar58._0_16_;
    if (lVar25 == (ulong)(uVar21 & 0xf) - 8) break;
    lVar26 = -0x10;
    auVar44 = local_3848;
    do {
      if (lVar26 == 0) break;
      uVar5 = *(uint *)(lVar31 + lVar26);
      if ((ulong)uVar5 == 0xffffffff) break;
      fVar8 = *(float *)(ray + 0x70);
      fVar9 = *(float *)(ray + 0x74);
      fVar42 = *(float *)(ray + 0x78);
      fVar104 = *(float *)(ray + 0x7c);
      fVar2 = *(float *)(lVar31 + -0x90 + lVar26);
      fVar3 = *(float *)(lVar31 + -0x80 + lVar26);
      fVar41 = *(float *)(lVar31 + -0x70 + lVar26);
      fVar59 = *(float *)(lVar31 + -0x120 + lVar26);
      fVar77 = *(float *)(lVar31 + -0x110 + lVar26);
      fVar79 = *(float *)(lVar31 + -0x100 + lVar26);
      auVar45._0_4_ = fVar8 * fVar2 + fVar59;
      auVar45._4_4_ = fVar9 * fVar2 + fVar59;
      auVar45._8_4_ = fVar42 * fVar2 + fVar59;
      auVar45._12_4_ = fVar104 * fVar2 + fVar59;
      auVar64._0_4_ = fVar8 * fVar3 + fVar77;
      auVar64._4_4_ = fVar9 * fVar3 + fVar77;
      auVar64._8_4_ = fVar42 * fVar3 + fVar77;
      auVar64._12_4_ = fVar104 * fVar3 + fVar77;
      auVar83._0_4_ = fVar8 * fVar41 + fVar79;
      auVar83._4_4_ = fVar9 * fVar41 + fVar79;
      auVar83._8_4_ = fVar42 * fVar41 + fVar79;
      auVar83._12_4_ = fVar104 * fVar41 + fVar79;
      fVar2 = *(float *)(lVar31 + -0x60 + lVar26);
      fVar3 = *(float *)(lVar31 + -0x50 + lVar26);
      fVar41 = *(float *)(lVar31 + -0x40 + lVar26);
      fVar59 = *(float *)(lVar31 + -0xf0 + lVar26);
      fVar77 = *(float *)(lVar31 + -0xe0 + lVar26);
      fVar79 = *(float *)(lVar31 + -0xd0 + lVar26);
      auVar93._0_4_ = fVar8 * fVar2 + fVar59;
      auVar93._4_4_ = fVar9 * fVar2 + fVar59;
      auVar93._8_4_ = fVar42 * fVar2 + fVar59;
      auVar93._12_4_ = fVar104 * fVar2 + fVar59;
      auVar100._0_4_ = fVar77 + fVar8 * fVar3;
      auVar100._4_4_ = fVar77 + fVar9 * fVar3;
      auVar100._8_4_ = fVar77 + fVar42 * fVar3;
      auVar100._12_4_ = fVar77 + fVar104 * fVar3;
      auVar109._0_4_ = fVar79 + fVar8 * fVar41;
      auVar109._4_4_ = fVar79 + fVar9 * fVar41;
      auVar109._8_4_ = fVar79 + fVar42 * fVar41;
      auVar109._12_4_ = fVar79 + fVar104 * fVar41;
      fVar2 = *(float *)(lVar31 + -0x30 + lVar26);
      fVar3 = *(float *)(lVar31 + -0x20 + lVar26);
      fVar41 = *(float *)(lVar31 + -0x10 + lVar26);
      fVar59 = *(float *)(lVar31 + -0xc0 + lVar26);
      fVar77 = *(float *)(lVar31 + -0xb0 + lVar26);
      fVar79 = *(float *)(lVar31 + -0xa0 + lVar26);
      auVar169._0_4_ = fVar59 + fVar8 * fVar2;
      auVar169._4_4_ = fVar59 + fVar9 * fVar2;
      auVar169._8_4_ = fVar59 + fVar42 * fVar2;
      auVar169._12_4_ = fVar59 + fVar104 * fVar2;
      auVar127._0_4_ = fVar3 * fVar8 + fVar77;
      auVar127._4_4_ = fVar3 * fVar9 + fVar77;
      auVar127._8_4_ = fVar3 * fVar42 + fVar77;
      auVar127._12_4_ = fVar3 * fVar104 + fVar77;
      auVar138._0_4_ = fVar79 + fVar41 * fVar8;
      auVar138._4_4_ = fVar79 + fVar41 * fVar9;
      auVar138._8_4_ = fVar79 + fVar41 * fVar42;
      auVar138._12_4_ = fVar79 + fVar41 * fVar104;
      auVar56 = *(undefined1 (*) [16])ray;
      auVar52 = *(undefined1 (*) [16])(ray + 0x10);
      auVar39 = *(undefined1 (*) [16])(ray + 0x20);
      auVar88 = vsubps_avx(auVar45,auVar56);
      auVar96 = vsubps_avx(auVar64,auVar52);
      auVar53 = vsubps_avx(auVar83,auVar39);
      auVar107 = vsubps_avx(auVar93,auVar56);
      auVar126 = vsubps_avx(auVar100,auVar52);
      auVar136 = vsubps_avx(auVar109,auVar39);
      auVar137 = vsubps_avx(auVar169,auVar56);
      auVar52 = vsubps_avx(auVar127,auVar52);
      auVar39 = vsubps_avx(auVar138,auVar39);
      auVar56 = vsubps_avx(auVar137,auVar88);
      auVar151 = vsubps_avx(auVar52,auVar96);
      auVar32 = vsubps_avx(auVar39,auVar53);
      fVar2 = auVar96._0_4_;
      fVar104 = auVar52._0_4_ + fVar2;
      fVar41 = auVar96._4_4_;
      fVar112 = auVar52._4_4_ + fVar41;
      fVar77 = auVar96._8_4_;
      fVar115 = auVar52._8_4_ + fVar77;
      fVar8 = auVar96._12_4_;
      fVar118 = auVar52._12_4_ + fVar8;
      fVar179 = auVar53._0_4_;
      fVar125 = fVar179 + auVar39._0_4_;
      fVar183 = auVar53._4_4_;
      fVar132 = fVar183 + auVar39._4_4_;
      fVar185 = auVar53._8_4_;
      fVar133 = fVar185 + auVar39._8_4_;
      fVar187 = auVar53._12_4_;
      fVar134 = fVar187 + auVar39._12_4_;
      fVar42 = auVar32._0_4_;
      auVar139._0_4_ = fVar104 * fVar42;
      fVar60 = auVar32._4_4_;
      auVar139._4_4_ = fVar112 * fVar60;
      fVar11 = auVar32._8_4_;
      auVar139._8_4_ = fVar115 * fVar11;
      fVar12 = auVar32._12_4_;
      auVar139._12_4_ = fVar118 * fVar12;
      fVar174 = auVar151._0_4_;
      auVar145._0_4_ = fVar174 * fVar125;
      fVar176 = auVar151._4_4_;
      auVar145._4_4_ = fVar176 * fVar132;
      fVar177 = auVar151._8_4_;
      auVar145._8_4_ = fVar177 * fVar133;
      fVar178 = auVar151._12_4_;
      auVar145._12_4_ = fVar178 * fVar134;
      auVar151 = vsubps_avx(auVar145,auVar139);
      fVar3 = auVar88._0_4_;
      fVar135 = auVar137._0_4_ + fVar3;
      fVar59 = auVar88._4_4_;
      fVar141 = auVar137._4_4_ + fVar59;
      fVar79 = auVar88._8_4_;
      fVar142 = auVar137._8_4_ + fVar79;
      fVar9 = auVar88._12_4_;
      fVar143 = auVar137._12_4_ + fVar9;
      fVar167 = auVar56._0_4_;
      auVar128._0_4_ = fVar167 * fVar125;
      fVar171 = auVar56._4_4_;
      auVar128._4_4_ = fVar171 * fVar132;
      fVar172 = auVar56._8_4_;
      auVar128._8_4_ = fVar172 * fVar133;
      fVar173 = auVar56._12_4_;
      auVar128._12_4_ = fVar173 * fVar134;
      auVar146._0_4_ = fVar135 * fVar42;
      auVar146._4_4_ = fVar141 * fVar60;
      auVar146._8_4_ = fVar142 * fVar11;
      auVar146._12_4_ = fVar143 * fVar12;
      auVar32 = vsubps_avx(auVar146,auVar128);
      auVar129._0_4_ = fVar135 * fVar174;
      auVar129._4_4_ = fVar141 * fVar176;
      auVar129._8_4_ = fVar142 * fVar177;
      auVar129._12_4_ = fVar143 * fVar178;
      auVar110._0_4_ = fVar167 * fVar104;
      auVar110._4_4_ = fVar171 * fVar112;
      auVar110._8_4_ = fVar172 * fVar115;
      auVar110._12_4_ = fVar173 * fVar118;
      auVar33 = vsubps_avx(auVar110,auVar129);
      auVar56 = *(undefined1 (*) [16])(ray + 0x60);
      fVar104 = auVar56._0_4_;
      fVar115 = auVar56._4_4_;
      fVar125 = auVar56._8_4_;
      fVar133 = auVar56._12_4_;
      fVar135 = *(float *)(ray + 0x50);
      fVar141 = *(float *)(ray + 0x54);
      fVar142 = *(float *)(ray + 0x58);
      auVar18 = *(undefined1 (*) [12])(ray + 0x50);
      fVar143 = *(float *)(ray + 0x5c);
      auVar17 = *(undefined1 (*) [12])(ray + 0x40);
      fVar13 = *(float *)(ray + 0x4c);
      fVar144 = auVar151._0_4_ * *(float *)(ray + 0x40) +
                fVar135 * auVar32._0_4_ + auVar33._0_4_ * fVar104;
      fVar148 = auVar151._4_4_ * *(float *)(ray + 0x44) +
                fVar141 * auVar32._4_4_ + auVar33._4_4_ * fVar115;
      auVar147._0_8_ = CONCAT44(fVar148,fVar144);
      auVar147._8_4_ =
           auVar151._8_4_ * *(float *)(ray + 0x48) +
           fVar142 * auVar32._8_4_ + auVar33._8_4_ * fVar125;
      auVar147._12_4_ =
           auVar151._12_4_ * fVar13 + fVar143 * auVar32._12_4_ + auVar33._12_4_ * fVar133;
      auVar56 = vsubps_avx(auVar96,auVar126);
      auVar96 = vsubps_avx(auVar53,auVar136);
      fVar105 = fVar2 + auVar126._0_4_;
      fVar113 = fVar41 + auVar126._4_4_;
      fVar116 = fVar77 + auVar126._8_4_;
      fVar119 = fVar8 + auVar126._12_4_;
      fVar180 = fVar179 + auVar136._0_4_;
      fVar184 = fVar183 + auVar136._4_4_;
      fVar186 = fVar185 + auVar136._8_4_;
      fVar188 = fVar187 + auVar136._12_4_;
      fVar112 = auVar96._0_4_;
      auVar170._0_4_ = fVar105 * fVar112;
      fVar118 = auVar96._4_4_;
      auVar170._4_4_ = fVar113 * fVar118;
      fVar132 = auVar96._8_4_;
      auVar170._8_4_ = fVar116 * fVar132;
      fVar134 = auVar96._12_4_;
      auVar170._12_4_ = fVar119 * fVar134;
      fVar158 = auVar56._0_4_;
      auVar65._0_4_ = fVar158 * fVar180;
      fVar162 = auVar56._4_4_;
      auVar65._4_4_ = fVar162 * fVar184;
      fVar164 = auVar56._8_4_;
      auVar65._8_4_ = fVar164 * fVar186;
      fVar166 = auVar56._12_4_;
      auVar65._12_4_ = fVar166 * fVar188;
      auVar56 = vsubps_avx(auVar65,auVar170);
      auVar88 = vsubps_avx(auVar88,auVar107);
      fVar149 = auVar88._0_4_;
      auVar182._0_4_ = fVar149 * fVar180;
      fVar152 = auVar88._4_4_;
      auVar182._4_4_ = fVar152 * fVar184;
      fVar154 = auVar88._8_4_;
      auVar182._8_4_ = fVar154 * fVar186;
      fVar156 = auVar88._12_4_;
      auVar182._12_4_ = fVar156 * fVar188;
      fVar180 = auVar107._0_4_ + fVar3;
      fVar184 = auVar107._4_4_ + fVar59;
      fVar186 = auVar107._8_4_ + fVar79;
      fVar188 = auVar107._12_4_ + fVar9;
      auVar130._0_4_ = fVar180 * fVar112;
      auVar130._4_4_ = fVar184 * fVar118;
      auVar130._8_4_ = fVar186 * fVar132;
      auVar130._12_4_ = fVar188 * fVar134;
      auVar88 = vsubps_avx(auVar130,auVar182);
      auVar122._0_4_ = fVar158 * fVar180;
      auVar122._4_4_ = fVar162 * fVar184;
      auVar122._8_4_ = fVar164 * fVar186;
      auVar122._12_4_ = fVar166 * fVar188;
      auVar111._0_4_ = fVar149 * fVar105;
      auVar111._4_4_ = fVar152 * fVar113;
      auVar111._8_4_ = fVar154 * fVar116;
      auVar111._12_4_ = fVar156 * fVar119;
      auVar96 = vsubps_avx(auVar111,auVar122);
      fVar159 = auVar17._0_4_;
      fVar163 = auVar17._4_4_;
      fVar165 = auVar17._8_4_;
      auVar123._0_4_ = fVar159 * auVar56._0_4_ + auVar96._0_4_ * fVar104 + fVar135 * auVar88._0_4_;
      auVar123._4_4_ = fVar163 * auVar56._4_4_ + auVar96._4_4_ * fVar115 + fVar141 * auVar88._4_4_;
      auVar123._8_4_ = fVar165 * auVar56._8_4_ + auVar96._8_4_ * fVar125 + fVar142 * auVar88._8_4_;
      auVar123._12_4_ =
           fVar13 * auVar56._12_4_ + auVar96._12_4_ * fVar133 + fVar143 * auVar88._12_4_;
      auVar56 = vsubps_avx(auVar107,auVar137);
      fVar180 = auVar107._0_4_ + auVar137._0_4_;
      fVar184 = auVar107._4_4_ + auVar137._4_4_;
      fVar186 = auVar107._8_4_ + auVar137._8_4_;
      fVar188 = auVar107._12_4_ + auVar137._12_4_;
      auVar88 = vsubps_avx(auVar126,auVar52);
      fVar105 = auVar126._0_4_ + auVar52._0_4_;
      fVar113 = auVar126._4_4_ + auVar52._4_4_;
      fVar116 = auVar126._8_4_ + auVar52._8_4_;
      fVar119 = auVar126._12_4_ + auVar52._12_4_;
      auVar52 = vsubps_avx(auVar136,auVar39);
      fVar61 = auVar136._0_4_ + auVar39._0_4_;
      fVar75 = auVar136._4_4_ + auVar39._4_4_;
      fVar76 = auVar136._8_4_ + auVar39._8_4_;
      fVar78 = auVar136._12_4_ + auVar39._12_4_;
      auVar140._8_4_ = 0x7fffffff;
      auVar140._0_8_ = 0x7fffffff7fffffff;
      auVar140._12_4_ = 0x7fffffff;
      fVar150 = auVar52._0_4_;
      auVar84._0_4_ = fVar150 * fVar105;
      fVar153 = auVar52._4_4_;
      auVar84._4_4_ = fVar153 * fVar113;
      fVar155 = auVar52._8_4_;
      auVar84._8_4_ = fVar155 * fVar116;
      fVar157 = auVar52._12_4_;
      auVar84._12_4_ = fVar157 * fVar119;
      fVar106 = auVar88._0_4_;
      auVar101._0_4_ = fVar106 * fVar61;
      fVar114 = auVar88._4_4_;
      auVar101._4_4_ = fVar114 * fVar75;
      fVar117 = auVar88._8_4_;
      auVar101._8_4_ = fVar117 * fVar76;
      fVar120 = auVar88._12_4_;
      auVar101._12_4_ = fVar120 * fVar78;
      auVar52 = vsubps_avx(auVar101,auVar84);
      fVar181 = auVar56._0_4_;
      auVar66._0_4_ = fVar181 * fVar61;
      fVar61 = auVar56._4_4_;
      auVar66._4_4_ = fVar61 * fVar75;
      fVar75 = auVar56._8_4_;
      auVar66._8_4_ = fVar75 * fVar76;
      fVar76 = auVar56._12_4_;
      auVar66._12_4_ = fVar76 * fVar78;
      auVar102._0_4_ = fVar150 * fVar180;
      auVar102._4_4_ = fVar153 * fVar184;
      auVar102._8_4_ = fVar155 * fVar186;
      auVar102._12_4_ = fVar157 * fVar188;
      auVar56 = vsubps_avx(auVar102,auVar66);
      auVar46._0_4_ = fVar180 * fVar106;
      auVar46._4_4_ = fVar184 * fVar114;
      auVar46._8_4_ = fVar186 * fVar117;
      auVar46._12_4_ = fVar188 * fVar120;
      auVar32._0_4_ = fVar181 * fVar105;
      auVar32._4_4_ = fVar61 * fVar113;
      auVar32._8_4_ = fVar75 * fVar116;
      auVar32._12_4_ = fVar76 * fVar119;
      auVar39 = vsubps_avx(auVar32,auVar46);
      auVar33._0_4_ = fVar159 * auVar52._0_4_ + fVar104 * auVar39._0_4_ + fVar135 * auVar56._0_4_;
      auVar33._4_4_ = fVar163 * auVar52._4_4_ + fVar115 * auVar39._4_4_ + fVar141 * auVar56._4_4_;
      auVar33._8_4_ = fVar165 * auVar52._8_4_ + fVar125 * auVar39._8_4_ + fVar142 * auVar56._8_4_;
      auVar33._12_4_ = fVar13 * auVar52._12_4_ + fVar133 * auVar39._12_4_ + fVar143 * auVar56._12_4_
      ;
      auVar161._0_4_ = auVar33._0_4_ + fVar144 + auVar123._0_4_;
      auVar161._4_4_ = auVar33._4_4_ + fVar148 + auVar123._4_4_;
      auVar161._8_4_ = auVar33._8_4_ + auVar147._8_4_ + auVar123._8_4_;
      auVar161._12_4_ = auVar33._12_4_ + auVar147._12_4_ + auVar123._12_4_;
      auVar56 = vandps_avx(auVar161,auVar140);
      auVar47._0_4_ = auVar56._0_4_ * 1.1920929e-07;
      auVar47._4_4_ = auVar56._4_4_ * 1.1920929e-07;
      auVar47._8_4_ = auVar56._8_4_ * 1.1920929e-07;
      auVar47._12_4_ = auVar56._12_4_ * 1.1920929e-07;
      auVar56 = vminps_avx(auVar147,auVar123);
      auVar56 = vminps_avx(auVar56,auVar33);
      uVar24 = CONCAT44(auVar47._4_4_,auVar47._0_4_);
      auVar85._0_8_ = uVar24 ^ 0x8000000080000000;
      auVar85._8_4_ = -auVar47._8_4_;
      auVar85._12_4_ = -auVar47._12_4_;
      auVar56 = vcmpps_avx(auVar56,auVar85,5);
      auVar52 = vmaxps_avx(auVar147,auVar123);
      auVar52 = vmaxps_avx(auVar52,auVar33);
      auVar52 = vcmpps_avx(auVar52,auVar47,2);
      auVar56 = vorps_avx(auVar56,auVar52);
      auVar52 = auVar44 & auVar56;
      auVar56 = vandps_avx(auVar56,auVar44);
      if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar52 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar52 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar52[0xf] < '\0'
         ) {
        auVar34._0_4_ = fVar158 * fVar42;
        auVar34._4_4_ = fVar162 * fVar60;
        auVar34._8_4_ = fVar164 * fVar11;
        auVar34._12_4_ = fVar166 * fVar12;
        auVar48._0_4_ = fVar174 * fVar112;
        auVar48._4_4_ = fVar176 * fVar118;
        auVar48._8_4_ = fVar177 * fVar132;
        auVar48._12_4_ = fVar178 * fVar134;
        auVar88 = vsubps_avx(auVar48,auVar34);
        auVar67._0_4_ = fVar106 * fVar112;
        auVar67._4_4_ = fVar114 * fVar118;
        auVar67._8_4_ = fVar117 * fVar132;
        auVar67._12_4_ = fVar120 * fVar134;
        auVar86._0_4_ = fVar158 * fVar150;
        auVar86._4_4_ = fVar162 * fVar153;
        auVar86._8_4_ = fVar164 * fVar155;
        auVar86._12_4_ = fVar166 * fVar157;
        auVar96 = vsubps_avx(auVar86,auVar67);
        auVar52 = vandps_avx(auVar140,auVar34);
        auVar39 = vandps_avx(auVar140,auVar67);
        auVar52 = vcmpps_avx(auVar52,auVar39,1);
        auVar88 = vblendvps_avx(auVar96,auVar88,auVar52);
        auVar35._0_4_ = fVar149 * fVar150;
        auVar35._4_4_ = fVar152 * fVar153;
        auVar35._8_4_ = fVar154 * fVar155;
        auVar35._12_4_ = fVar156 * fVar157;
        auVar49._0_4_ = fVar149 * fVar42;
        auVar49._4_4_ = fVar152 * fVar60;
        auVar49._8_4_ = fVar154 * fVar11;
        auVar49._12_4_ = fVar156 * fVar12;
        auVar68._0_4_ = fVar167 * fVar112;
        auVar68._4_4_ = fVar171 * fVar118;
        auVar68._8_4_ = fVar172 * fVar132;
        auVar68._12_4_ = fVar173 * fVar134;
        auVar96 = vsubps_avx(auVar49,auVar68);
        auVar94._0_4_ = fVar181 * fVar112;
        auVar94._4_4_ = fVar61 * fVar118;
        auVar94._8_4_ = fVar75 * fVar132;
        auVar94._12_4_ = fVar76 * fVar134;
        auVar53 = vsubps_avx(auVar94,auVar35);
        auVar52 = vandps_avx(auVar140,auVar68);
        auVar39 = vandps_avx(auVar140,auVar35);
        auVar52 = vcmpps_avx(auVar52,auVar39,1);
        auVar96 = vblendvps_avx(auVar53,auVar96,auVar52);
        auVar50._0_4_ = fVar181 * fVar158;
        auVar50._4_4_ = fVar61 * fVar162;
        auVar50._8_4_ = fVar75 * fVar164;
        auVar50._12_4_ = fVar76 * fVar166;
        auVar69._0_4_ = fVar158 * fVar167;
        auVar69._4_4_ = fVar162 * fVar171;
        auVar69._8_4_ = fVar164 * fVar172;
        auVar69._12_4_ = fVar166 * fVar173;
        auVar95._0_4_ = fVar149 * fVar174;
        auVar95._4_4_ = fVar152 * fVar176;
        auVar95._8_4_ = fVar154 * fVar177;
        auVar95._12_4_ = fVar156 * fVar178;
        auVar103._0_4_ = fVar149 * fVar106;
        auVar103._4_4_ = fVar152 * fVar114;
        auVar103._8_4_ = fVar154 * fVar117;
        auVar103._12_4_ = fVar156 * fVar120;
        auVar53 = vsubps_avx(auVar69,auVar95);
        auVar107 = vsubps_avx(auVar103,auVar50);
        auVar52 = vandps_avx(auVar140,auVar95);
        auVar39 = vandps_avx(auVar140,auVar50);
        auVar52 = vcmpps_avx(auVar52,auVar39,1);
        auVar39 = vblendvps_avx(auVar107,auVar53,auVar52);
        local_38a8 = auVar18._0_4_;
        fStack_38a4 = auVar18._4_4_;
        fStack_38a0 = auVar18._8_4_;
        fVar42 = fVar159 * auVar88._0_4_ + auVar39._0_4_ * fVar104 + auVar96._0_4_ * local_38a8;
        fVar104 = fVar163 * auVar88._4_4_ + auVar39._4_4_ * fVar115 + auVar96._4_4_ * fStack_38a4;
        fVar112 = fVar165 * auVar88._8_4_ + auVar39._8_4_ * fVar125 + auVar96._8_4_ * fStack_38a0;
        fVar60 = fVar13 * auVar88._12_4_ + auVar39._12_4_ * fVar133 + auVar96._12_4_ * fVar143;
        auVar51._0_4_ = fVar42 + fVar42;
        auVar51._4_4_ = fVar104 + fVar104;
        auVar51._8_4_ = fVar112 + fVar112;
        auVar51._12_4_ = fVar60 + fVar60;
        fVar42 = auVar88._0_4_ * fVar3 + auVar39._0_4_ * fVar179 + auVar96._0_4_ * fVar2;
        fVar104 = auVar88._4_4_ * fVar59 + auVar39._4_4_ * fVar183 + auVar96._4_4_ * fVar41;
        fVar77 = auVar88._8_4_ * fVar79 + auVar39._8_4_ * fVar185 + auVar96._8_4_ * fVar77;
        fVar79 = auVar88._12_4_ * fVar9 + auVar39._12_4_ * fVar187 + auVar96._12_4_ * fVar8;
        auVar52 = vrcpps_avx(auVar51);
        fVar2 = auVar52._0_4_;
        auVar124._0_4_ = auVar51._0_4_ * fVar2;
        fVar3 = auVar52._4_4_;
        auVar124._4_4_ = auVar51._4_4_ * fVar3;
        fVar41 = auVar52._8_4_;
        auVar124._8_4_ = auVar51._8_4_ * fVar41;
        fVar59 = auVar52._12_4_;
        auVar124._12_4_ = auVar51._12_4_ * fVar59;
        auVar131._8_4_ = 0x3f800000;
        auVar131._0_8_ = 0x3f8000003f800000;
        auVar131._12_4_ = 0x3f800000;
        auVar52 = vsubps_avx(auVar131,auVar124);
        auVar70._0_4_ = (fVar42 + fVar42) * (fVar2 + fVar2 * auVar52._0_4_);
        auVar70._4_4_ = (fVar104 + fVar104) * (fVar3 + fVar3 * auVar52._4_4_);
        auVar70._8_4_ = (fVar77 + fVar77) * (fVar41 + fVar41 * auVar52._8_4_);
        auVar70._12_4_ = (fVar79 + fVar79) * (fVar59 + fVar59 * auVar52._12_4_);
        auVar52 = vcmpps_avx(auVar70,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar53 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar70,2);
        auVar52 = vandps_avx(auVar53,auVar52);
        auVar53 = vcmpps_avx(auVar51,_DAT_01f45a50,4);
        auVar52 = vandps_avx(auVar53,auVar52);
        auVar52 = vpslld_avx(auVar52,0x1f);
        auVar53 = vpsrad_avx(auVar52,0x1f);
        auVar52 = auVar56 & auVar53;
        auVar56 = vandps_avx(auVar56,auVar53);
        if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar52 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar52 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar52[0xf] < '\0') {
          uStack_3630 = auVar147._8_8_;
          uStack_3650 = uStack_3630;
          local_36b8 = auVar39;
          local_36a8 = auVar96;
          local_3698 = auVar88;
          local_3688 = auVar70;
          local_3678 = auVar161;
          _local_3668 = auVar123;
          local_3658 = auVar147._0_8_;
        }
      }
      pGVar6 = (context->scene->geometries).items[uVar5].ptr;
      uVar4 = pGVar6->mask;
      auVar36._4_4_ = uVar4;
      auVar36._0_4_ = uVar4;
      auVar36._8_4_ = uVar4;
      auVar36._12_4_ = uVar4;
      auVar52 = vandps_avx(auVar36,*(undefined1 (*) [16])(ray + 0x90));
      auVar52 = vpcmpeqd_avx(auVar52,_DAT_01f45a50);
      auVar39 = auVar56 & ~auVar52;
      if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar39[0xf] < '\0'
         ) {
        uVar4 = *(uint *)(lVar31 + 0x10 + lVar26);
        auVar56 = vandnps_avx(auVar52,auVar56);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar37._8_4_ = 0x7fffffff;
          auVar37._0_8_ = 0x7fffffff7fffffff;
          auVar37._12_4_ = 0x7fffffff;
          auVar52 = vandps_avx(local_3678,auVar37);
          auVar39 = vrcpps_avx(local_3678);
          fVar2 = auVar39._0_4_;
          auVar71._0_4_ = local_3678._0_4_ * fVar2;
          fVar3 = auVar39._4_4_;
          auVar71._4_4_ = local_3678._4_4_ * fVar3;
          fVar41 = auVar39._8_4_;
          auVar71._8_4_ = local_3678._8_4_ * fVar41;
          fVar59 = auVar39._12_4_;
          auVar71._12_4_ = local_3678._12_4_ * fVar59;
          auVar87._8_4_ = 0x3f800000;
          auVar87._0_8_ = 0x3f8000003f800000;
          auVar87._12_4_ = 0x3f800000;
          auVar39 = vsubps_avx(auVar87,auVar71);
          auVar54._0_4_ = fVar2 + fVar2 * auVar39._0_4_;
          auVar54._4_4_ = fVar3 + fVar3 * auVar39._4_4_;
          auVar54._8_4_ = fVar41 + fVar41 * auVar39._8_4_;
          auVar54._12_4_ = fVar59 + fVar59 * auVar39._12_4_;
          auVar72._8_4_ = 0x219392ef;
          auVar72._0_8_ = 0x219392ef219392ef;
          auVar72._12_4_ = 0x219392ef;
          auVar52 = vcmpps_avx(auVar52,auVar72,5);
          auVar52 = vandps_avx(auVar52,auVar54);
          auVar55._0_4_ = auVar52._0_4_ * (float)local_3658;
          auVar55._4_4_ = auVar52._4_4_ * local_3658._4_4_;
          auVar55._8_4_ = auVar52._8_4_ * (float)uStack_3650;
          auVar55._12_4_ = auVar52._12_4_ * uStack_3650._4_4_;
          local_3548 = vminps_avx(auVar55,auVar87);
          auVar38._0_4_ = auVar52._0_4_ * (float)local_3668._0_4_;
          auVar38._4_4_ = auVar52._4_4_ * (float)local_3668._4_4_;
          auVar38._8_4_ = auVar52._8_4_ * fStack_3660;
          auVar38._12_4_ = auVar52._12_4_ * fStack_365c;
          local_3558 = vminps_avx(auVar38,auVar87);
          local_3598._0_8_ = local_3698._0_8_;
          local_3598._8_8_ = local_3698._8_8_;
          local_3598._16_8_ = local_36a8._0_8_;
          local_3598._24_8_ = local_36a8._8_8_;
          local_3598._32_8_ = local_36b8._0_8_;
          local_3598._40_8_ = local_36b8._8_8_;
          local_3568 = local_3688._0_8_;
          uStack_3560 = local_3688._8_8_;
          args.valid = (int *)&Ng;
          args.geometryUserPtr = &t;
          args.context = (RTCRayQueryContext *)&v;
          args.ray = (RTCRayN *)&u;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
          ::
          _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                      *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                               *)&local_3598.field_0);
          local_3538 = vshufps_avx(ZEXT416(uVar5),ZEXT416(uVar5),0);
          auVar52 = ZEXT416(uVar4);
          local_3548 = vshufps_avx(auVar52,auVar52,0);
          local_3598._0_8_ = Ng.field_0._0_8_;
          local_3598._8_8_ = Ng.field_0._8_8_;
          local_3598._16_8_ = Ng.field_0._16_8_;
          local_3598._24_8_ = Ng.field_0._24_8_;
          local_3598._32_8_ = Ng.field_0._32_8_;
          local_3598._40_8_ = Ng.field_0._40_8_;
          local_3568 = u.field_0._0_8_;
          uStack_3560 = u.field_0._8_8_;
          vcmpps_avx(ZEXT1632(local_3538),ZEXT1632(local_3538),0xf);
          uStack_3524 = context->user->instID[0];
          local_3528 = uStack_3524;
          uStack_3520 = uStack_3524;
          uStack_351c = uStack_3524;
          uStack_3518 = context->user->instPrimID[0];
          uStack_3514 = uStack_3518;
          uStack_3510 = uStack_3518;
          uStack_350c = uStack_3518;
          auVar52 = *(undefined1 (*) [16])(ray + 0x80);
          auVar39 = vblendvps_avx(auVar52,(undefined1  [16])t.field_0,auVar56);
          *(undefined1 (*) [16])(ray + 0x80) = auVar39;
          args.valid = (int *)local_37d8;
          args.geometryUserPtr = pGVar6->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_3598;
          args.N = 4;
          args.ray = (RTCRayN *)ray;
          local_37d8 = auVar56;
          if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar6->occlusionFilterN)(&args);
          }
          if (local_37d8 == (undefined1  [16])0x0) {
            auVar56 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
            auVar56 = auVar56 ^ _DAT_01f46b70;
          }
          else {
            p_Var7 = context->args->filter;
            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var7)(&args);
            }
            auVar39 = vpcmpeqd_avx(local_37d8,_DAT_01f45a50);
            auVar56 = auVar39 ^ _DAT_01f46b70;
            auVar73._8_4_ = 0xff800000;
            auVar73._0_8_ = 0xff800000ff800000;
            auVar73._12_4_ = 0xff800000;
            auVar39 = vblendvps_avx(auVar73,*(undefined1 (*) [16])(args.ray + 0x80),auVar39);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar39;
          }
          auVar39 = vpslld_avx(auVar56,0x1f);
          auVar56 = vpsrad_avx(auVar39,0x1f);
          auVar52 = vblendvps_avx(auVar52,*(undefined1 (*) [16])pRVar1,auVar39);
          *(undefined1 (*) [16])pRVar1 = auVar52;
        }
        auVar44 = vandnps_avx(auVar56,auVar44);
      }
      lVar26 = lVar26 + 4;
    } while ((((auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar44 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             auVar44[0xf] < '\0');
    auVar58 = ZEXT1664(local_3848);
    auVar52 = vandps_avx(auVar44,local_3848);
    lVar25 = lVar25 + 1;
    lVar31 = lVar31 + 0x140;
    auVar44 = local_3848 & auVar44;
    auVar56 = local_3848;
    local_3848 = auVar52;
  } while ((((auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar44 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           auVar44[0xf] < '\0');
  auVar56 = vpcmpeqd_avx(auVar56,auVar56);
  auVar40._0_4_ = local_3848._0_4_ ^ auVar56._0_4_;
  auVar40._4_4_ = local_3848._4_4_ ^ auVar56._4_4_;
  auVar40._8_4_ = local_3848._8_4_ ^ auVar56._8_4_;
  auVar40._12_4_ = local_3848._12_4_ ^ auVar56._12_4_;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx(auVar40,(undefined1  [16])vVar19.field_0);
  auVar56 = auVar56 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar56 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar56 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar56 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar56[0xf])
  goto LAB_00fb79a5;
  auVar74._8_4_ = 0xff800000;
  auVar74._0_8_ = 0xff800000ff800000;
  auVar74._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar74,
                     (undefined1  [16])terminated.field_0);
  goto LAB_00fb6c2b;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }